

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * cmQtAutoGen::SubDirPrefix(string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  size_type slash_pos;
  string *filename_local;
  
  lVar1 = std::__cxx11::string::rfind((char)filename,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::SubDirPrefix(std::string const& filename)
{
  std::string::size_type slash_pos = filename.rfind('/');
  if (slash_pos == std::string::npos) {
    return std::string();
  }
  return filename.substr(0, slash_pos + 1);
}